

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::generateCentralCameraSystem(translations_t *camOffsets,rotations_t *camRotations)

{
  pointer *ppMVar1;
  pointer *ppMVar2;
  iterator __position;
  iterator __position_00;
  ActualDstType actualDst;
  Matrix<double,_3,_3,_0,_3,_3> local_58;
  
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  __position._M_current =
       (camOffsets->
       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)camOffsets,__position,(Matrix<double,_3,_1,_0,_3,_1> *)&local_58);
  }
  else {
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
    m_storage.m_data.array[0] = 0.0;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
    m_storage.m_data.array[1] = 0.0;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
    m_storage.m_data.array[2] = 0.0;
    ppMVar1 = &(camOffsets->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  __position_00._M_current =
       (camRotations->
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (camRotations->
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)camRotations,__position_00,&local_58);
  }
  else {
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[8] = 1.0;
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[0] = 1.0;
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[1] = 0.0;
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[2] = 0.0;
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[3] = 0.0;
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[4] = 1.0;
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[5] = 0.0;
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[6] = 0.0;
    ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
    m_storage.m_data.array[7] = 0.0;
    ppMVar2 = &(camRotations->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  return;
}

Assistant:

void
opengv::generateCentralCameraSystem(
    translations_t & camOffsets,
    rotations_t & camRotations )
{
  //create a fake camera system for a central camera
  camOffsets.push_back(Eigen::Vector3d::Zero());
  camRotations.push_back(Eigen::Matrix3d::Identity());
}